

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDAnalyzerResults.cpp
# Opt level: O2

string * __thiscall
SWDAnalyzerResults::GetSampleTimeStr_abi_cxx11_
          (string *__return_storage_ptr__,SWDAnalyzerResults *this,S64 sample)

{
  uint uVar1;
  ulonglong uVar2;
  size_t sVar3;
  char time_str [128];
  allocator local_a9;
  char local_a8 [136];
  
  uVar2 = Analyzer::GetTriggerSample();
  uVar1 = Analyzer::GetSampleRate();
  AnalyzerHelpers::GetTimeString(sample,uVar2,uVar1,local_a8,0x80);
  sVar3 = strlen(local_a8);
  if (7 < (int)sVar3) {
    local_a8[(int)sVar3 - 7] = '\0';
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_a8,&local_a9);
  return __return_storage_ptr__;
}

Assistant:

std::string SWDAnalyzerResults::GetSampleTimeStr( S64 sample ) const
{
    char time_str[ 128 ];
    AnalyzerHelpers::GetTimeString( sample, mAnalyzer->GetTriggerSample(), mAnalyzer->GetSampleRate(), time_str, sizeof( time_str ) );

    // remove trailing zeros
    int l = strlen( time_str );
    if( l > 7 )
        time_str[ l - 7 ] = '\0';

    return time_str;
}